

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.h
# Opt level: O2

void __thiscall
csguide_webserver::Logger::Log<char_const*,char_const*,char_const*>
          (Logger *this,LogLevel level,string *fmt_str,char *args,char *args_1,char *args_2)

{
  char *__lhs;
  ostream *poVar1;
  string formatted_msg;
  string message;
  allocator local_a9;
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  
  std::__cxx11::string::string
            ((string *)&local_a8,(fmt_str->_M_dataplus)._M_p,(allocator *)&local_88);
  FormatMessage(&local_48,this,&local_a8,args,args_1,args_2);
  std::__cxx11::string::~string((string *)&local_a8);
  __lhs = LogLevelToString(this,level);
  std::__cxx11::string::string((string *)&local_68,": ",&local_a9);
  std::operator+(&local_88,__lhs,&local_68);
  std::operator+(&local_a8,&local_88,&local_48);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_68);
  if (this->use_file_ == false) {
    this = (Logger *)&std::cout;
  }
  poVar1 = std::operator<<((ostream *)this,(string *)&local_a8);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void Logger::Log(LogLevel level, const std::string& fmt_str, Args... args) {
  std::string message = FormatMessage(fmt_str.c_str(), args...);
  std::string formatted_msg = LogLevelToString(level) + std::string(": ") + message;

  if (use_file_) {
    log_file_ << formatted_msg << std::endl;
  } else {
    std::cout << formatted_msg << std::endl;
  }
}